

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image.h
# Opt level: O1

int stbi_info_from_callbacks(stbi_io_callbacks *c,void *user,int *x,int *y,int *comp)

{
  int iVar1;
  stbi__context s;
  stbi__context local_100;
  
  local_100.io.eof = c->eof;
  local_100.img_buffer = local_100.buffer_start;
  local_100.io.read = c->read;
  local_100.io.skip = c->skip;
  local_100.read_from_callbacks = 1;
  local_100.buflen = 0x80;
  local_100.callback_already_read = 0;
  local_100.io_user_data = user;
  local_100.img_buffer_original = local_100.img_buffer;
  stbi__refill_buffer(&local_100);
  local_100.img_buffer_original_end = local_100.img_buffer_end;
  iVar1 = stbi__info_main(&local_100,x,y,comp);
  return iVar1;
}

Assistant:

STBIDEF int stbi_info_from_callbacks(stbi_io_callbacks const *c, void *user, int *x, int *y, int *comp)
{
   stbi__context s;
   stbi__start_callbacks(&s, (stbi_io_callbacks *) c, user);
   return stbi__info_main(&s,x,y,comp);
}